

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall tinyusdz::GPrim::has_primvar(GPrim *this,string *varname)

{
  const_iterator cVar1;
  string primvar_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,"primvars:",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)varname);
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::find(&(this->props)._M_t,(key_type *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (_Rb_tree_header *)cVar1._M_node != &(this->props)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool GPrim::has_primvar(const std::string &varname) const {
  std::string primvar_name = kPrimvars + varname;
  return props.count(primvar_name);
}